

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O2

RPCHelpMan * getmempoolinfo(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  RPCMethodImpl fun;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  undefined8 in_stack_fffffffffffff2c8;
  undefined8 in_stack_fffffffffffff2d0;
  undefined8 in_stack_fffffffffffff2d8;
  undefined8 in_stack_fffffffffffff2e0;
  _Manager_type in_stack_fffffffffffff2e8;
  undefined8 in_stack_fffffffffffff2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff2f8;
  pointer in_stack_fffffffffffff308;
  pointer pRVar2;
  pointer in_stack_fffffffffffff310;
  pointer pRVar3;
  pointer in_stack_fffffffffffff318;
  pointer pRVar4;
  undefined8 in_stack_fffffffffffff320;
  pointer pRVar5;
  pointer pRVar6;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffff340;
  pointer pRVar8;
  pointer pRVar9;
  pointer pRVar10;
  undefined8 in_stack_fffffffffffff360;
  pointer pRVar11;
  pointer pRVar12;
  allocator<char> local_c7a;
  allocator<char> local_c79;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c78;
  allocator<char> local_c59;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c58;
  allocator<char> local_c3a;
  allocator<char> local_c39;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c38;
  allocator<char> local_c19;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c18;
  allocator<char> local_bfa;
  allocator<char> local_bf9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_bf8;
  allocator<char> local_bda;
  allocator<char> local_bd9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_bd8;
  allocator<char> local_bba;
  allocator<char> local_bb9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_bb8;
  allocator<char> local_b92;
  allocator<char> local_b91;
  vector<RPCResult,_std::allocator<RPCResult>_> local_b90;
  allocator<char> local_b72;
  allocator<char> local_b71;
  RPCResults local_b70;
  vector<RPCArg,_std::allocator<RPCArg>_> local_b58;
  allocator<char> local_b32;
  allocator<char> local_b31;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  char *local_a50;
  size_type local_a48;
  char local_a40 [8];
  undefined8 uStack_a38;
  string local_a30 [32];
  string local_a10 [32];
  string local_9f0 [32];
  string local_9d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  string local_970 [32];
  string local_950 [32];
  string local_930 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  string local_8d0 [32];
  string local_8b0 [32];
  string local_890 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  RPCResult local_710 [4];
  RPCResult local_4f0;
  RPCResult local_468;
  RPCResult local_3e0;
  RPCResult local_358;
  RPCResult local_2d0;
  RPCResult local_248;
  RPCResult local_1c0;
  string local_138 [32];
  string local_118 [32];
  RPCResult local_f8;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"getmempoolinfo",&local_b31);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"Returns details on the active state of the TX memory pool.",&local_b32);
  local_b58.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b58.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b58.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",&local_b71);
  std::__cxx11::string::string<std::allocator<char>>(local_138,"",&local_b72);
  std::__cxx11::string::string<std::allocator<char>>(local_730,"loaded",&local_b91);
  std::__cxx11::string::string<std::allocator<char>>
            (local_750,"True if the initial load attempt of the persisted mempool finished",
             &local_b92);
  local_bb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_bb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_bb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff2d0;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2c8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff2d8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff2e0;
  description._M_string_length = in_stack_fffffffffffff2f0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2e8;
  description.field_2 = in_stack_fffffffffffff2f8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff310;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff308;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff318;
  RPCResult::RPCResult(local_710,BOOL,m_key_name,description,inner,SUB81(local_730,0));
  std::__cxx11::string::string<std::allocator<char>>(local_770,"size",&local_bb9);
  std::__cxx11::string::string<std::allocator<char>>(local_790,"Current tx count",&local_bba);
  local_bd8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_bd8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_bd8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_string_length = in_stack_fffffffffffff2d0;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2c8;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff2d8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff2e0;
  description_00._M_string_length = in_stack_fffffffffffff2f0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2e8;
  description_00.field_2 = in_stack_fffffffffffff2f8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff310;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff308;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff318;
  RPCResult::RPCResult(local_710 + 1,NUM,m_key_name_00,description_00,inner_00,SUB81(local_770,0));
  std::__cxx11::string::string<std::allocator<char>>(local_7b0,"bytes",&local_bd9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7d0,
             "Sum of all virtual transaction sizes as defined in BIP 141. Differs from actual serialized size because witness data is discounted"
             ,&local_bda);
  local_bf8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_bf8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_bf8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_string_length = in_stack_fffffffffffff2d0;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2c8;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff2d8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff2e0;
  description_01._M_string_length = in_stack_fffffffffffff2f0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2e8;
  description_01.field_2 = in_stack_fffffffffffff2f8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff310;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff308;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff318;
  RPCResult::RPCResult(local_710 + 2,NUM,m_key_name_01,description_01,inner_01,SUB81(local_7b0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_7f0,"usage",&local_bf9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_810,"Total memory usage for the mempool",&local_bfa);
  local_c18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_string_length = in_stack_fffffffffffff2d0;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2c8;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff2d8;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff2e0;
  description_02._M_string_length = in_stack_fffffffffffff2f0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2e8;
  description_02.field_2 = in_stack_fffffffffffff2f8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff310;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff308;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff318;
  RPCResult::RPCResult(local_710 + 3,NUM,m_key_name_02,description_02,inner_02,SUB81(local_7f0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_830,"total_fee",&local_c19);
  std::operator+(&local_870,"Total fees for the mempool in ",&CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_850,&local_870,", ignoring modified fees through prioritisetransaction");
  local_c38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_string_length = in_stack_fffffffffffff2d0;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2c8;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff2d8;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff2e0;
  description_03._M_string_length = in_stack_fffffffffffff2f0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2e8;
  description_03.field_2 = in_stack_fffffffffffff2f8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff310;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff308;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff318;
  RPCResult::RPCResult
            (&local_4f0,STR_AMOUNT,m_key_name_03,description_03,inner_03,SUB81(local_830,0));
  std::__cxx11::string::string<std::allocator<char>>(local_890,"maxmempool",&local_c39);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8b0,"Maximum memory usage for the mempool",&local_c3a);
  local_c58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_string_length = in_stack_fffffffffffff2d0;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2c8;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff2d8;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff2e0;
  description_04._M_string_length = in_stack_fffffffffffff2f0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2e8;
  description_04.field_2 = in_stack_fffffffffffff2f8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff310;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff308;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff318;
  RPCResult::RPCResult(&local_468,NUM,m_key_name_04,description_04,inner_04,SUB81(local_890,0));
  std::__cxx11::string::string<std::allocator<char>>(local_8d0,"mempoolminfee",&local_c59);
  std::operator+(&local_910,"Minimum fee rate in ",&CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_8f0,&local_910,
                 "/kvB for tx to be accepted. Is the maximum of minrelaytxfee and minimum mempool fee"
                );
  local_c78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_string_length = in_stack_fffffffffffff2d0;
  m_key_name_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2c8;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff2d8;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff2e0;
  description_05._M_string_length = in_stack_fffffffffffff2f0;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2e8;
  description_05.field_2 = in_stack_fffffffffffff2f8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff310;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff308;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff318;
  RPCResult::RPCResult
            (&local_3e0,STR_AMOUNT,m_key_name_05,description_05,inner_05,SUB81(local_8d0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_930,"minrelaytxfee",&local_c79);
  std::__cxx11::string::string<std::allocator<char>>
            (local_950,"Current minimum relay fee for transactions",&local_c7a);
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  m_key_name_06._M_string_length = in_stack_fffffffffffff2d0;
  m_key_name_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2c8;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_fffffffffffff2d8;
  m_key_name_06.field_2._8_8_ = in_stack_fffffffffffff2e0;
  description_06._M_string_length = in_stack_fffffffffffff2f0;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2e8;
  description_06.field_2 = in_stack_fffffffffffff2f8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff310;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff308;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff318;
  RPCResult::RPCResult
            (&local_358,STR_AMOUNT,m_key_name_06,description_06,inner_06,SUB81(local_930,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_970,"incrementalrelayfee",(allocator<char> *)&stack0xfffffffffffff367);
  std::operator+(&local_9b0,"minimum fee rate increment for mempool limiting or replacement in ",
                 &CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_990,&local_9b0,"/kvB");
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name_07._M_string_length = in_stack_fffffffffffff2d0;
  m_key_name_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2c8;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_fffffffffffff2d8;
  m_key_name_07.field_2._8_8_ = in_stack_fffffffffffff2e0;
  description_07._M_string_length = in_stack_fffffffffffff2f0;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2e8;
  description_07.field_2 = in_stack_fffffffffffff2f8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff310;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff308;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff318;
  RPCResult::RPCResult(&local_2d0,NUM,m_key_name_07,description_07,inner_07,SUB81(local_970,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_9d0,"unbroadcastcount",(allocator<char> *)&stack0xfffffffffffff347);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9f0,"Current number of transactions that haven\'t passed initial broadcast yet",
             (allocator<char> *)&stack0xfffffffffffff346);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name_08._M_string_length = in_stack_fffffffffffff2d0;
  m_key_name_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2c8;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_fffffffffffff2d8;
  m_key_name_08.field_2._8_8_ = in_stack_fffffffffffff2e0;
  description_08._M_string_length = in_stack_fffffffffffff2f0;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2e8;
  description_08.field_2 = in_stack_fffffffffffff2f8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff310;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff308;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff318;
  RPCResult::RPCResult(&local_248,NUM,m_key_name_08,description_08,inner_08,SUB81(local_9d0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_a10,"fullrbf",(allocator<char> *)&stack0xfffffffffffff327);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a30,"True if the mempool accepts RBF without replaceability signaling inspection"
             ,(allocator<char> *)&stack0xfffffffffffff326);
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name_09._M_string_length = in_stack_fffffffffffff2d0;
  m_key_name_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2c8;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_fffffffffffff2d8;
  m_key_name_09.field_2._8_8_ = in_stack_fffffffffffff2e0;
  description_09._M_string_length = in_stack_fffffffffffff2f0;
  description_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2e8;
  description_09.field_2._M_local_buf = in_stack_fffffffffffff2f8._M_local_buf;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_1c0,BOOL,m_key_name_09,description_09,inner_09,SUB81(local_a10,0));
  __l._M_len = 0xb;
  __l._M_array = local_710;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_b90,__l,(allocator_type *)&stack0xfffffffffffff307);
  m_key_name_10._M_string_length = in_stack_fffffffffffff2d0;
  m_key_name_10._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2c8;
  m_key_name_10.field_2._M_allocated_capacity = in_stack_fffffffffffff2d8;
  m_key_name_10.field_2._8_8_ = in_stack_fffffffffffff2e0;
  description_10._M_string_length = in_stack_fffffffffffff2f0;
  description_10._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2e8;
  description_10.field_2 = in_stack_fffffffffffff2f8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_f8,OBJ,m_key_name_10,description_10,inner_10,SUB81(local_118,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2d0;
  result._0_8_ = in_stack_fffffffffffff2c8;
  result.m_key_name._M_string_length = in_stack_fffffffffffff2d8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff2e0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff2e8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff2f0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff2f8;
  result._64_8_ = pRVar2;
  result.m_description._M_dataplus._M_p = (pointer)pRVar3;
  result.m_description._M_string_length = (size_type)pRVar4;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff320;
  result.m_description.field_2._8_8_ = pRVar5;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar6;
  result.m_cond._M_string_length = (size_type)pRVar7;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff340;
  result.m_cond.field_2._8_8_ = pRVar8;
  RPCResults::RPCResults(&local_b70,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ab0,"getmempoolinfo",(allocator<char> *)&stack0xfffffffffffff306);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ad0,"",(allocator<char> *)&stack0xfffffffffffff305);
  HelpExampleCli(&local_a90,&local_ab0,&local_ad0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b10,"getmempoolinfo",(allocator<char> *)&stack0xfffffffffffff304);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b30,"",(allocator<char> *)&stack0xfffffffffffff303);
  HelpExampleRpc(&local_af0,&local_b10,&local_b30);
  std::operator+(&local_a70,&local_a90,&local_af0);
  local_a50 = local_a40;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a70._M_dataplus._M_p == &local_a70.field_2) {
    uStack_a38 = local_a70.field_2._8_8_;
  }
  else {
    local_a50 = local_a70._M_dataplus._M_p;
  }
  local_a48 = local_a70._M_string_length;
  local_a70._M_string_length = 0;
  local_a70.field_2._M_local_buf[0] = '\0';
  description_11._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:710:9)>
       ::_M_invoke;
  description_11._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:710:9)>
                ::_M_manager;
  description_11.field_2 = in_stack_fffffffffffff2f8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar4;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar5;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff320;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar6;
  examples.m_examples._M_string_length = in_stack_fffffffffffff340;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar7;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar8;
  examples.m_examples.field_2._8_8_ = pRVar9;
  fun.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff360;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar10;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar11;
  fun._M_invoker = (_Invoker_type)pRVar12;
  local_a70._M_dataplus._M_p = (pointer)&local_a70.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff2d0,&stack0xfffffffffffff2d8)),
             description_11,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff2d8);
  std::__cxx11::string::~string((string *)&local_a50);
  std::__cxx11::string::~string((string *)&local_a70);
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_b30);
  std::__cxx11::string::~string((string *)&local_b10);
  std::__cxx11::string::~string((string *)&local_a90);
  std::__cxx11::string::~string((string *)&local_ad0);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_b70.m_results);
  RPCResult::~RPCResult(&local_f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_b90);
  lVar1 = 0x550;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_710[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff308);
  std::__cxx11::string::~string(local_a30);
  std::__cxx11::string::~string(local_a10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff328);
  std::__cxx11::string::~string(local_9f0);
  std::__cxx11::string::~string(local_9d0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff348);
  std::__cxx11::string::~string((string *)&local_990);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::__cxx11::string::~string(local_970);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff368);
  std::__cxx11::string::~string(local_950);
  std::__cxx11::string::~string(local_930);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c78);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::~string(local_8d0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c58);
  std::__cxx11::string::~string(local_8b0);
  std::__cxx11::string::~string(local_890);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c38);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::string::~string(local_830);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c18);
  std::__cxx11::string::~string(local_810);
  std::__cxx11::string::~string(local_7f0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_bf8);
  std::__cxx11::string::~string(local_7d0);
  std::__cxx11::string::~string(local_7b0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_bd8);
  std::__cxx11::string::~string(local_790);
  std::__cxx11::string::~string(local_770);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_bb8);
  std::__cxx11::string::~string(local_750);
  std::__cxx11::string::~string(local_730);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_118);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_b58);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getmempoolinfo()
{
    return RPCHelpMan{"getmempoolinfo",
        "Returns details on the active state of the TX memory pool.",
        {},
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::BOOL, "loaded", "True if the initial load attempt of the persisted mempool finished"},
                {RPCResult::Type::NUM, "size", "Current tx count"},
                {RPCResult::Type::NUM, "bytes", "Sum of all virtual transaction sizes as defined in BIP 141. Differs from actual serialized size because witness data is discounted"},
                {RPCResult::Type::NUM, "usage", "Total memory usage for the mempool"},
                {RPCResult::Type::STR_AMOUNT, "total_fee", "Total fees for the mempool in " + CURRENCY_UNIT + ", ignoring modified fees through prioritisetransaction"},
                {RPCResult::Type::NUM, "maxmempool", "Maximum memory usage for the mempool"},
                {RPCResult::Type::STR_AMOUNT, "mempoolminfee", "Minimum fee rate in " + CURRENCY_UNIT + "/kvB for tx to be accepted. Is the maximum of minrelaytxfee and minimum mempool fee"},
                {RPCResult::Type::STR_AMOUNT, "minrelaytxfee", "Current minimum relay fee for transactions"},
                {RPCResult::Type::NUM, "incrementalrelayfee", "minimum fee rate increment for mempool limiting or replacement in " + CURRENCY_UNIT + "/kvB"},
                {RPCResult::Type::NUM, "unbroadcastcount", "Current number of transactions that haven't passed initial broadcast yet"},
                {RPCResult::Type::BOOL, "fullrbf", "True if the mempool accepts RBF without replaceability signaling inspection"},
            }},
        RPCExamples{
            HelpExampleCli("getmempoolinfo", "")
            + HelpExampleRpc("getmempoolinfo", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    return MempoolInfoToJSON(EnsureAnyMemPool(request.context));
},
    };
}